

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llog_message.cpp
# Opt level: O0

void __thiscall ins::LLogMessage::~LLogMessage(LLogMessage *this)

{
  LLog *this_00;
  string local_40 [48];
  LLogMessage *local_10;
  LLogMessage *this_local;
  
  local_10 = this;
  std::operator<<((ostream *)this,'\n');
  this_00 = LLog::Instance();
  std::__cxx11::ostringstream::str();
  LLog::operator<<(this_00,local_40);
  std::__cxx11::string::~string((string *)local_40);
  if ((this->fatal_ & 1U) != 0) {
    exit(1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)this);
  return;
}

Assistant:

LLogMessage::~LLogMessage() {
  oss_ << '\n';
  LLog::Instance() << oss_.str();
  if (fatal_) {
#if _WIN32
    system("pause");
#endif // _WIN32
    exit(EXIT_FAILURE);
  }
}